

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O3

void __thiscall nuraft::buffer::put(buffer *this,byte *ba,size_t len)

{
  uint uVar1;
  uint uVar2;
  overflow_error *this_00;
  uint uVar3;
  long lVar4;
  buffer *pbVar5;
  
  uVar1 = *(uint *)this;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar2 = *(uint *)(this + 4);
    lVar4 = 8;
  }
  else {
    uVar2 = uVar1 >> 0x10;
    lVar4 = 4;
  }
  if (3 < (ulong)(uVar3 & uVar1) - (ulong)uVar2) {
    pbVar5 = this + (ulong)uVar2 + lVar4;
    lVar4 = 0;
    do {
      *pbVar5 = SUB81(len >> ((byte)lVar4 & 0x3f),0);
      lVar4 = lVar4 + 8;
      pbVar5 = pbVar5 + 1;
    } while (lVar4 != 0x20);
    if (*(int *)this < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 4;
    }
    else {
      *(short *)(this + 2) = (short)((uint)*(int *)this >> 0x10) + 4;
    }
    put_raw(this,ba,len);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer to store int32 length");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}